

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_manager.cc
# Opt level: O3

RC __thiscall QL_Manager::SetUpFirstNode(QL_Manager *this,QL_Node **topNode)

{
  char **ppcVar1;
  int iVar2;
  uint uVar3;
  RelCatEntry *pRVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  Condition condition;
  Condition *pCVar7;
  RC RVar8;
  QL_NodeRel *this_00;
  int *attrs;
  long lVar9;
  mapped_type *pmVar10;
  Condition *pCVar11;
  QL_NodeSel *this_01;
  int attrlistSize;
  bool bVar12;
  int index;
  int numConds;
  string relString;
  key_type local_6c;
  uint local_68;
  int local_64;
  int local_60;
  int local_5c;
  QL_Node **local_58;
  key_type local_50;
  
  this_00 = (QL_NodeRel *)operator_new(0x120);
  QL_NodeRel::QL_NodeRel(this_00,this,this->relEntries);
  *topNode = (QL_Node *)this_00;
  pRVar4 = this->relEntries;
  attrs = (int *)malloc((long)pRVar4->attrCount << 2);
  attrs[0] = 0;
  attrs[1] = 0;
  if (0 < pRVar4->attrCount) {
    lVar9 = 0;
    do {
      attrs[lVar9] = 0;
      lVar9 = lVar9 + 1;
    } while (lVar9 < pRVar4->attrCount);
  }
  std::__cxx11::string::string((string *)&local_50,pRVar4->relName,(allocator *)&local_60);
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::operator[](&this->relToAttrIndex,&local_50);
  pRVar4 = this->relEntries;
  attrlistSize = pRVar4->attrCount;
  if (0 < attrlistSize) {
    iVar2 = *pmVar10;
    lVar9 = 0;
    do {
      attrs[lVar9] = iVar2 + (int)lVar9;
      lVar9 = lVar9 + 1;
      attrlistSize = pRVar4->attrCount;
    } while (lVar9 < attrlistSize);
  }
  QL_NodeRel::SetUpNode(this_00,attrs,attrlistSize);
  free(attrs);
  RVar8 = 0;
  CountNumConditions(this,0,&local_60);
  local_6c = 0;
  if (0 < this->nConds) {
    local_5c = local_60;
    bVar12 = false;
    local_68 = 0;
    local_58 = topNode;
    do {
      pmVar10 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[](&this->conditionToRel,&local_6c);
      if (*pmVar10 == 0) {
        if ((((this->condptr[local_6c].op == EQ_OP) &&
             (pCVar11 = this->condptr + local_6c, pCVar11->bRhsIsAttr == 0)) &&
            ((local_68 & 1) == 0)) && (this->isUpdate == false)) {
          local_64 = 0;
          RVar8 = GetAttrCatEntryPos(this,pCVar11->lhsAttr,&local_64);
          if (RVar8 != 0) goto LAB_0010f4c1;
          uVar3 = this->attrEntries[local_64].indexNo;
          if (uVar3 != 0xffffffff) {
            RVar8 = (*(this_00->super_QL_Node)._vptr_QL_Node[8])
                              (this_00,(long)local_64,(ulong)uVar3,
                               this->condptr[local_6c].rhsValue.data);
            if (RVar8 == 0) {
              local_68 = 1;
              goto LAB_0010f4a8;
            }
            goto LAB_0010f4c1;
          }
        }
        if (bVar12) {
          this_01 = (QL_NodeSel *)*local_58;
        }
        else {
          this_01 = (QL_NodeSel *)operator_new(0x58);
          QL_NodeSel::QL_NodeSel(this_01,this,(QL_Node *)this_00);
          RVar8 = QL_NodeSel::SetUpNode(this_01,local_5c);
          if (RVar8 != 0) goto LAB_0010f4c1;
          *local_58 = (QL_Node *)this_01;
        }
        pCVar11 = this->condptr;
        lVar9 = (long)local_6c;
        pCVar7 = pCVar11 + lVar9;
        uVar5 = pCVar7->op;
        uVar6 = pCVar7->bRhsIsAttr;
        condition.bRhsIsAttr = uVar6;
        condition.op = uVar5;
        ppcVar1 = &pCVar11[lVar9].rhsAttr.attrName;
        condition.lhsAttr = pCVar11[lVar9].lhsAttr;
        condition.rhsAttr.relName = ((RelAttr *)(&pCVar7->op + 2))->relName;
        condition.rhsAttr.attrName = *ppcVar1;
        condition.rhsValue._0_8_ = ppcVar1[1];
        condition.rhsValue.data = pCVar11[lVar9].rhsValue.data;
        RVar8 = QL_Node::AddCondition(&this_01->super_QL_Node,condition,local_6c);
        bVar12 = true;
        if (RVar8 != 0) goto LAB_0010f4c1;
      }
LAB_0010f4a8:
      local_6c = local_6c + 1;
    } while (local_6c < this->nConds);
    RVar8 = 0;
  }
LAB_0010f4c1:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return RVar8;
}

Assistant:

RC QL_Manager::SetUpFirstNode(QL_Node *&topNode){
  RC rc = 0;
  bool useSelNode = false; // whether a select node was used with this relation
  bool useIndex = false; // whether an index is being used on this relation
  int relIndex = 0; // take the first element of relEntries as the 1st relation

  QL_NodeRel *relNode = new QL_NodeRel(*this, relEntries);
  topNode = relNode;

  // Create the list of attributes associated with this relation
  int *attrList = (int *)malloc(relEntries[relIndex].attrCount * sizeof(int));
  memset((void *)attrList, 0, sizeof(attrList));
  for(int i = 0;  i < relEntries[relIndex].attrCount ; i++){
    attrList[i] = 0;
  }
  string relString(relEntries[relIndex].relName);
  int start = relToAttrIndex[relString];
  for(int i = 0;  i < relEntries[relIndex].attrCount ; i++){
    attrList[i] = start + i;
  }
  // Set up the relation node with this list of attributes
  relNode->SetUpNode(attrList, relEntries[relIndex].attrCount);
  free(attrList);

  // count the number of conditions associated with this node:
  int numConds;
  CountNumConditions(0, numConds);

  // For each of the conditions, add it to the relation
  for(int i = 0 ; i < nConds; i++){
    if(conditionToRel[i] == 0){
      bool added = false;
      // If it is a R.A=v condition, make the relation use index scan if there isn't already
      // an index, and if this isn't a update operation
      if(condptr[i].op == EQ_OP && !condptr[i].bRhsIsAttr && useIndex == false && isUpdate == false){
        int index = 0;
        if((rc = GetAttrCatEntryPos(condptr[i].lhsAttr, index) ))
          return (rc);
        if((attrEntries[index].indexNo != -1)){ // add only if there is an index on this attribute
          if((rc = relNode->UseIndex(index, attrEntries[index].indexNo, condptr[i].rhsValue.data) ))
            return (rc);
          added = true;
          useIndex = true;
        }
      }
      // Otherwise, create a select node and add the condition to the select node (or just add
      // if select node has already been created)
      if(! added && !useSelNode){
        QL_NodeSel *selNode = new QL_NodeSel(*this, *relNode);
        if((rc = selNode->SetUpNode(numConds) ))
          return (rc);
        topNode = selNode;
        useSelNode = true;
      }
      if(! added){
        if((rc = topNode->AddCondition(condptr[i], i) ))
          return (rc);
      }
    }
  }
  return (0);
}